

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O3

size_t ptls_asn1_get_expected_type_and_length
                 (uint8_t *bytes,size_t bytes_max,size_t byte_index,uint8_t expected_type,
                 uint32_t *length,int *indefinite_length,size_t *last_byte,int *decode_error,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  uint in_EAX;
  ulong uStack_38;
  int is_indefinite;
  
  uStack_38 = (ulong)in_EAX;
  if (bytes[byte_index] == expected_type) {
    byte_index = ptls_asn1_read_length
                           (bytes,bytes_max,byte_index + 1,length,&is_indefinite,last_byte,
                            decode_error,0,log_ctx);
    if (indefinite_length == (int *)0x0) {
      if (is_indefinite != 0) {
        if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
          (*log_ctx->fn)(log_ctx->ctx,"   ");
          (*log_ctx->fn)(log_ctx->ctx,"Error: %s (near position: %d (0x%x) out of %d)",
                         "Incorrect length for DER",byte_index & 0xffffffff,byte_index & 0xffffffff,
                         bytes_max & 0xffffffff);
        }
        *decode_error = 0x23a;
      }
    }
    else {
      *indefinite_length = is_indefinite;
    }
  }
  else {
    if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
      (*log_ctx->fn)(log_ctx->ctx,"   ");
      (*log_ctx->fn)(log_ctx->ctx,"Error: %s (near position: %d (0x%x) out of %d)","Unexpected type"
                     ,byte_index & 0xffffffff,byte_index & 0xffffffff,bytes_max & 0xffffffff);
    }
    *decode_error = 0x23b;
  }
  return byte_index;
}

Assistant:

size_t ptls_asn1_get_expected_type_and_length(const uint8_t *bytes, size_t bytes_max, size_t byte_index, uint8_t expected_type,
                                              uint32_t *length, int *indefinite_length, size_t *last_byte, int *decode_error,
                                              ptls_minicrypto_log_ctx_t *log_ctx)
{
    int is_indefinite = 0;

    /* Check that the expected type is present */
    if (bytes[byte_index] != expected_type) {
        byte_index = ptls_asn1_error_message("Unexpected type", bytes_max, byte_index, 0, log_ctx);
        *decode_error = PTLS_ERROR_INCORRECT_ASN1_SYNTAX;
    } else {
        /* get length of element */
        byte_index++;
        byte_index =
            ptls_asn1_read_length(bytes, bytes_max, byte_index, length, &is_indefinite, last_byte, decode_error, 0, log_ctx);

        if (indefinite_length != NULL) {
            *indefinite_length = is_indefinite;
        } else if (is_indefinite) {
            byte_index = ptls_asn1_error_message("Incorrect length for DER", bytes_max, byte_index, 0, log_ctx);
            *decode_error = PTLS_ERROR_DER_INDEFINITE_LENGTH;
        }
    }

    return byte_index;
}